

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store_array_text<float>
          (XMLWriter *this,char *name,vector<float,_std::allocator<float>_> *vec)

{
  int __oflag;
  size_t i;
  ulong uVar1;
  int local_6c;
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,name,(allocator *)&local_6c);
  open(this,(char *)local_48,__oflag);
  std::__cxx11::string::~string(local_48);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    tab(this);
    local_6c = (int)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar1];
    store_array_elt(this,&local_6c);
  }
  std::__cxx11::string::string(local_68,name,(allocator *)&local_6c);
  close(this,(int)local_68);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }